

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimizer.hpp
# Opt level: O0

void __thiscall Optimizer::optimize(Optimizer *this,ScheduleHandle *origin,string *output_path)

{
  uint uVar1;
  bool bVar2;
  element_type *peVar3;
  undefined8 uVar4;
  const_reference pvVar5;
  size_type sVar6;
  undefined8 uVar7;
  char *pcVar8;
  pair<unsigned_long,_unsigned_long> pVar9;
  pair<std::_Rb_tree_const_iterator<unsigned_long>,_bool> pVar10;
  undefined1 local_210 [96];
  string local_1b0 [32];
  _Base_ptr local_190;
  undefined1 local_188;
  size_t local_180;
  size_t local_178;
  __shared_ptr_access<Schedule,_(__gnu_cxx::_Lock_policy)2,_false,_false> *local_170;
  shared_ptr<Schedule> *substitution;
  iterator __end2;
  iterator __begin2;
  vector<std::shared_ptr<Schedule>,_std::allocator<std::shared_ptr<Schedule>_>_> *__range2;
  vector<std::shared_ptr<Schedule>,_std::allocator<std::shared_ptr<Schedule>_>_> substitutions;
  undefined1 local_130 [8];
  value_type top;
  int count;
  Timer timer;
  size_t local_e0;
  vector<std::shared_ptr<Schedule>,_std::allocator<std::shared_ptr<Schedule>_>_> local_d8;
  undefined1 local_b8 [8];
  priority_queue<std::shared_ptr<Schedule>,_std::vector<std::shared_ptr<Schedule>,_std::allocator<std::shared_ptr<Schedule>_>_>,_Comparator>
  queue;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> hash_set;
  undefined1 local_40 [8];
  Comparator comparator;
  ScheduleHandle best;
  string *output_path_local;
  ScheduleHandle *origin_local;
  Optimizer *this_local;
  
  std::shared_ptr<Schedule>::shared_ptr((shared_ptr<Schedule> *)&comparator.limit,origin);
  peVar3 = std::__shared_ptr_access<Schedule,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Schedule,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      origin);
  pVar9 = Schedule::analyze(peVar3);
  local_40 = (undefined1  [8])pVar9.second;
  comparator.origin_time = this->limit;
  std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::set
            ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
             &queue.comp.limit);
  local_d8.
  super__Vector_base<std::shared_ptr<Schedule>,_std::allocator<std::shared_ptr<Schedule>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.
  super__Vector_base<std::shared_ptr<Schedule>,_std::allocator<std::shared_ptr<Schedule>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8.
  super__Vector_base<std::shared_ptr<Schedule>,_std::allocator<std::shared_ptr<Schedule>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<std::shared_ptr<Schedule>,_std::allocator<std::shared_ptr<Schedule>_>_>::vector
            (&local_d8);
  std::
  priority_queue<std::shared_ptr<Schedule>,_std::vector<std::shared_ptr<Schedule>,_std::allocator<std::shared_ptr<Schedule>_>_>,_Comparator>
  ::priority_queue((priority_queue<std::shared_ptr<Schedule>,_std::vector<std::shared_ptr<Schedule>,_std::allocator<std::shared_ptr<Schedule>_>_>,_Comparator>
                    *)local_b8,(Comparator *)local_40,&local_d8);
  std::vector<std::shared_ptr<Schedule>,_std::allocator<std::shared_ptr<Schedule>_>_>::~vector
            (&local_d8);
  std::
  priority_queue<std::shared_ptr<Schedule>,_std::vector<std::shared_ptr<Schedule>,_std::allocator<std::shared_ptr<Schedule>_>_>,_Comparator>
  ::push((priority_queue<std::shared_ptr<Schedule>,_std::vector<std::shared_ptr<Schedule>,_std::allocator<std::shared_ptr<Schedule>_>_>,_Comparator>
          *)local_b8,origin);
  peVar3 = std::__shared_ptr_access<Schedule,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Schedule,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      origin);
  local_e0 = Schedule::hash(peVar3);
  std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::insert
            ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
             &queue.comp.limit,&local_e0);
  std::__shared_ptr_access<Schedule,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<Schedule,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)origin);
  Schedule::info_abi_cxx11_((Schedule *)&timer);
  uVar4 = std::__cxx11::string::c_str();
  printf(" > Start back-tracing search from source (%s)\n",uVar4);
  std::__cxx11::string::~string((string *)&timer);
  Timer::Timer((Timer *)&stack0xfffffffffffffee8);
  top.super___shared_ptr<Schedule,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ = 0;
  do {
    bVar2 = std::
            priority_queue<std::shared_ptr<Schedule>,_std::vector<std::shared_ptr<Schedule>,_std::allocator<std::shared_ptr<Schedule>_>_>,_Comparator>
            ::empty((priority_queue<std::shared_ptr<Schedule>,_std::vector<std::shared_ptr<Schedule>,_std::allocator<std::shared_ptr<Schedule>_>_>,_Comparator>
                     *)local_b8);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    pvVar5 = std::
             priority_queue<std::shared_ptr<Schedule>,_std::vector<std::shared_ptr<Schedule>,_std::allocator<std::shared_ptr<Schedule>_>_>,_Comparator>
             ::top((priority_queue<std::shared_ptr<Schedule>,_std::vector<std::shared_ptr<Schedule>,_std::allocator<std::shared_ptr<Schedule>_>_>,_Comparator>
                    *)local_b8);
    std::shared_ptr<Schedule>::shared_ptr((shared_ptr<Schedule> *)local_130,pvVar5);
    std::
    priority_queue<std::shared_ptr<Schedule>,_std::vector<std::shared_ptr<Schedule>,_std::allocator<std::shared_ptr<Schedule>_>_>,_Comparator>
    ::pop((priority_queue<std::shared_ptr<Schedule>,_std::vector<std::shared_ptr<Schedule>,_std::allocator<std::shared_ptr<Schedule>_>_>,_Comparator>
           *)local_b8);
    bVar2 = Comparator::considerable
                      ((Comparator *)local_40,(ScheduleHandle *)&comparator.limit,
                       (ScheduleHandle *)local_130);
    if (bVar2) {
      top.super___shared_ptr<Schedule,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
           top.super___shared_ptr<Schedule,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ + 1;
      generateSubstitutions
                ((vector<std::shared_ptr<Schedule>,_std::allocator<std::shared_ptr<Schedule>_>_> *)
                 &__range2,(ScheduleHandle *)local_130);
      __end2 = std::vector<std::shared_ptr<Schedule>,_std::allocator<std::shared_ptr<Schedule>_>_>::
               begin((vector<std::shared_ptr<Schedule>,_std::allocator<std::shared_ptr<Schedule>_>_>
                      *)&__range2);
      substitution = (shared_ptr<Schedule> *)
                     std::
                     vector<std::shared_ptr<Schedule>,_std::allocator<std::shared_ptr<Schedule>_>_>
                     ::end((vector<std::shared_ptr<Schedule>,_std::allocator<std::shared_ptr<Schedule>_>_>
                            *)&__range2);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<std::shared_ptr<Schedule>_*,_std::vector<std::shared_ptr<Schedule>,_std::allocator<std::shared_ptr<Schedule>_>_>_>
                                         *)&substitution), bVar2) {
        local_170 = (__shared_ptr_access<Schedule,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                    __gnu_cxx::
                    __normal_iterator<std::shared_ptr<Schedule>_*,_std::vector<std::shared_ptr<Schedule>,_std::allocator<std::shared_ptr<Schedule>_>_>_>
                    ::operator*(&__end2);
        peVar3 = std::__shared_ptr_access<Schedule,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->(local_170);
        local_178 = Schedule::hash(peVar3);
        sVar6 = std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::
                count((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                       *)&queue.comp.limit,&local_178);
        if (sVar6 == 0) {
          bVar2 = Comparator::considerable
                            ((Comparator *)local_40,(ScheduleHandle *)&comparator.limit,
                             (ScheduleHandle *)local_170);
          if (bVar2) {
            std::
            priority_queue<std::shared_ptr<Schedule>,_std::vector<std::shared_ptr<Schedule>,_std::allocator<std::shared_ptr<Schedule>_>_>,_Comparator>
            ::push((priority_queue<std::shared_ptr<Schedule>,_std::vector<std::shared_ptr<Schedule>,_std::allocator<std::shared_ptr<Schedule>_>_>,_Comparator>
                    *)local_b8,(value_type *)local_170);
            peVar3 = std::__shared_ptr_access<Schedule,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->(local_170);
            local_180 = Schedule::hash(peVar3);
            pVar10 = std::
                     set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::
                     insert((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                             *)&queue.comp.limit,&local_180);
            local_190 = (_Base_ptr)pVar10.first._M_node;
            local_188 = pVar10.second;
          }
          bVar2 = Comparator::operator()
                            ((Comparator *)local_40,(ScheduleHandle *)&comparator.limit,
                             (ScheduleHandle *)local_170);
          if (bVar2) {
            std::shared_ptr<Schedule>::operator=
                      ((shared_ptr<Schedule> *)&comparator.limit,(shared_ptr<Schedule> *)local_170);
          }
        }
        __gnu_cxx::
        __normal_iterator<std::shared_ptr<Schedule>_*,_std::vector<std::shared_ptr<Schedule>,_std::allocator<std::shared_ptr<Schedule>_>_>_>
        ::operator++(&__end2);
      }
      bVar2 = Comparator::satisfy((Comparator *)local_40,(ScheduleHandle *)&comparator.limit);
      uVar1 = top.super___shared_ptr<Schedule,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_;
      if (bVar2) {
        printf(" > Already satisfy requirement, stop searching\n");
        substitutions.
        super__Vector_base<std::shared_ptr<Schedule>,_std::allocator<std::shared_ptr<Schedule>_>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 3;
      }
      else if (top.super___shared_ptr<Schedule,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_
               == 0x5dc) {
        printf(" > Reach search limit, stop searching\n");
        substitutions.
        super__Vector_base<std::shared_ptr<Schedule>,_std::allocator<std::shared_ptr<Schedule>_>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 3;
      }
      else {
        if ((int)top.super___shared_ptr<Schedule,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
                 _4_4_ % 300 == 0) {
          std::__shared_ptr_access<Schedule,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                    ((__shared_ptr_access<Schedule,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                     local_130);
          prettyBytes_abi_cxx11_((size_t)local_1b0);
          uVar4 = std::__cxx11::string::c_str();
          std::__shared_ptr_access<Schedule,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                    ((__shared_ptr_access<Schedule,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                     local_130);
          prettyNanoseconds_abi_cxx11_((uint64_t)(local_210 + 0x40));
          uVar7 = std::__cxx11::string::c_str();
          printf(" > Progress (%d): %s, %s\n",(ulong)uVar1,uVar4,uVar7);
          std::__cxx11::string::~string((string *)(local_210 + 0x40));
          std::__cxx11::string::~string(local_1b0);
        }
        substitutions.
        super__Vector_base<std::shared_ptr<Schedule>,_std::allocator<std::shared_ptr<Schedule>_>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
      }
      std::vector<std::shared_ptr<Schedule>,_std::allocator<std::shared_ptr<Schedule>_>_>::~vector
                ((vector<std::shared_ptr<Schedule>,_std::allocator<std::shared_ptr<Schedule>_>_> *)
                 &__range2);
    }
    else {
      substitutions.
      super__Vector_base<std::shared_ptr<Schedule>,_std::allocator<std::shared_ptr<Schedule>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 2;
    }
    std::shared_ptr<Schedule>::~shared_ptr((shared_ptr<Schedule> *)local_130);
  } while ((substitutions.
            super__Vector_base<std::shared_ptr<Schedule>,_std::allocator<std::shared_ptr<Schedule>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == 0) ||
          (substitutions.
           super__Vector_base<std::shared_ptr<Schedule>,_std::allocator<std::shared_ptr<Schedule>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == 2));
  printf(" > Result:\n");
  printf("   > Schedules searched: %d\n",
         (ulong)top.super___shared_ptr<Schedule,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_
        );
  Timer::tik((Timer *)&stack0xfffffffffffffee8);
  prettyNanoseconds_abi_cxx11_((uint64_t)(local_210 + 0x20));
  uVar4 = std::__cxx11::string::c_str();
  printf("   > Time used: %s\n",uVar4);
  std::__cxx11::string::~string((string *)(local_210 + 0x20));
  std::__shared_ptr_access<Schedule,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<Schedule,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &comparator.limit);
  Schedule::info_abi_cxx11_((Schedule *)local_210);
  uVar4 = std::__cxx11::string::c_str();
  printf("   > Best: {%s}\n",uVar4);
  std::__cxx11::string::~string((string *)local_210);
  peVar3 = std::__shared_ptr_access<Schedule,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Schedule,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &comparator.limit);
  pcVar8 = "false";
  if (peVar3->peak_memory <= this->limit) {
    pcVar8 = "true";
  }
  printf("   > Satisfy memory: %s\n",pcVar8);
  uVar4 = std::__cxx11::string::c_str();
  printf(" > Writing result into path %s ... ",uVar4);
  peVar3 = std::__shared_ptr_access<Schedule,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Schedule,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &comparator.limit);
  Schedule::restoreAndDumpToFile(peVar3,output_path);
  printf("OK!\n");
  std::
  priority_queue<std::shared_ptr<Schedule>,_std::vector<std::shared_ptr<Schedule>,_std::allocator<std::shared_ptr<Schedule>_>_>,_Comparator>
  ::~priority_queue((priority_queue<std::shared_ptr<Schedule>,_std::vector<std::shared_ptr<Schedule>,_std::allocator<std::shared_ptr<Schedule>_>_>,_Comparator>
                     *)local_b8);
  std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::~set
            ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
             &queue.comp.limit);
  std::shared_ptr<Schedule>::~shared_ptr((shared_ptr<Schedule> *)&comparator.limit);
  return;
}

Assistant:

void optimize(const ScheduleHandle &origin, const std::string &output_path) const {
        ScheduleHandle best = origin;
        auto comparator = Comparator{origin->analyze().second, limit};
        std::set<size_t> hash_set;
        std::priority_queue<ScheduleHandle, std::vector<ScheduleHandle>, Comparator> queue(comparator);

        // Source
        queue.push(origin);
        hash_set.insert(origin->hash());

        // Back-tracing search
        printf(" > Start back-tracing search from source (%s)\n", origin->info().c_str());
        Timer timer;
        int count = 0;
        while (not queue.empty()) {
            auto top = queue.top();
            queue.pop();

            if (not comparator.considerable(best, top)) {
                continue;
            }

            ++ count;

            // Substitute
            std::vector<ScheduleHandle> substitutions = generateSubstitutions(top);

            // Insert and check
            for (auto &substitution: substitutions) {
                if (hash_set.count(substitution->hash())) {
                    continue;
                }
                if (comparator.considerable(best, substitution)) {
                    queue.push(substitution);
                    hash_set.insert(substitution->hash());
                }
                if (comparator(best, substitution)) {
                    best = substitution;
                }
            }

            if (comparator.satisfy(best)) {
                printf(" > Already satisfy requirement, stop searching\n");
                break;
            }

            if (count == SEARCH_LIMIT) {
                printf(" > Reach search limit, stop searching\n");
                break;
            }

            if (count % PRINT_FREQUENCY == 0) {
                printf(" > Progress (%d): %s, %s\n", count, prettyBytes(top->peak_memory).c_str(), prettyNanoseconds(top->total_time).c_str());
            }
        }

        // Show best
        printf(" > Result:\n");
        printf("   > Schedules searched: %d\n", count);
        printf("   > Time used: %s\n", prettyNanoseconds(timer.tik()).c_str());
        printf("   > Best: {%s}\n", best->info().c_str());
        printf("   > Satisfy memory: %s\n", best->peak_memory <= limit ? "true" : "false");

        // Write result
        printf(" > Writing result into path %s ... ", output_path.c_str());
        best->restoreAndDumpToFile(output_path);
        printf("OK!\n");
    }